

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_test_helper.cpp
# Opt level: O2

vector<duckdb::Value,_true> *
duckdb::ArrowTestHelper::ConstructArrowScan
          (vector<duckdb::Value,_true> *__return_storage_ptr__,ArrowTestFactory *factory)

{
  Value local_50 [64];
  
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  duckdb::Value::POINTER((ulong)local_50);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
            (&__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>,
             local_50);
  duckdb::Value::~Value(local_50);
  duckdb::Value::POINTER((ulong)local_50);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
            (&__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>,
             local_50);
  duckdb::Value::~Value(local_50);
  duckdb::Value::POINTER((ulong)local_50);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
            (&__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>,
             local_50);
  duckdb::Value::~Value(local_50);
  return __return_storage_ptr__;
}

Assistant:

vector<Value> ArrowTestHelper::ConstructArrowScan(ArrowTestFactory &factory) {
	vector<Value> params;
	auto arrow_object = (uintptr_t)(&factory);
	params.push_back(Value::POINTER(arrow_object));
	params.push_back(Value::POINTER((uintptr_t)&ArrowTestFactory::CreateStream));
	params.push_back(Value::POINTER((uintptr_t)&ArrowTestFactory::GetSchema));
	return params;
}